

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall pegmatite::ParserDelegate::~ParserDelegate(ParserDelegate *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static inline bool parseCharacter(Context &con, char32_t character)
{
	if (!con.end())
	{
		char32_t ch = con.symbol();
		if (ch == character)
		{
			con.next_col();
			return true;
		}
	}
	con.set_error_pos();
	return false;
}